

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ReadIdentifier(AsciiParser *this,string *token)

{
  int *piVar1;
  StreamReader *pSVar2;
  string sVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  char c;
  stringstream ss;
  string local_1d0 [32];
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  bVar4 = Char1(this,(char *)local_1d0);
  sVar3 = local_1d0[0];
  if (bVar4) {
    if ((char)local_1d0[0] != 0x5f) {
      iVar5 = isalpha((int)(char)local_1d0[0]);
      if (iVar5 == 0) {
        pSVar2 = this->_sr;
        if ((0 < (long)pSVar2->idx_) && (uVar6 = pSVar2->idx_ - 1, uVar6 <= pSVar2->length_)) {
          pSVar2->idx_ = uVar6;
        }
        goto LAB_002888b0;
      }
    }
    piVar1 = &(this->_curr_cursor).col;
    *piVar1 = *piVar1 + 1;
    ::std::operator<<(local_1a0,(char)sVar3);
    while( true ) {
      bVar4 = Eof(this);
      if (bVar4) break;
      bVar4 = Char1(this,(char *)local_1d0);
      sVar3 = local_1d0[0];
      if (!bVar4) goto LAB_002888b0;
      if ((char)local_1d0[0] != 0x5f) {
        iVar5 = isalnum((int)(char)local_1d0[0]);
        if (iVar5 == 0) {
          pSVar2 = this->_sr;
          if ((0 < (long)pSVar2->idx_) && (uVar6 = pSVar2->idx_ - 1, uVar6 <= pSVar2->length_)) {
            pSVar2->idx_ = uVar6;
          }
          break;
        }
      }
      piVar1 = &(this->_curr_cursor).col;
      *piVar1 = *piVar1 + 1;
      ::std::operator<<(local_1a0,(char)sVar3);
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::operator=((string *)token,local_1d0);
    ::std::__cxx11::string::_M_dispose();
    bVar4 = true;
  }
  else {
LAB_002888b0:
    bVar4 = false;
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  return bVar4;
}

Assistant:

bool AsciiParser::ReadIdentifier(std::string *token) {
  // identifier = (`_` | [a-zA-Z]) (`_` | [a-zA-Z0-9]+)
  std::stringstream ss;

  // The first character.
  {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      DCOUT("read1 failed.");
      return false;
    }

    if (c == '_') {
      // ok
    } else if (!std::isalpha(int(c))) {
      DCOUT(fmt::format("Invalid identiefier: '{}'", c));
      _sr->seek_from_current(-1);
      return false;
    }
    _curr_cursor.col++;

    ss << c;
  }

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    if (c == '_') {
      // ok
    } else if (!std::isalnum(int(c))) {
      _sr->seek_from_current(-1);
      break;  // end of identifier(e.g. ' ')
    }

    _curr_cursor.col++;

    ss << c;
  }

  (*token) = ss.str();
  return true;
}